

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.h
# Opt level: O0

uint64_t prng_rand(prng_rand_t *state)

{
  uint_fast16_t new_rands;
  uint_fast16_t r;
  uint_fast16_t i;
  prng_rand_t *state_local;
  
  if (state->c == 0) {
    new_rands = 0x1f0;
    state->c = 0x36;
  }
  else {
    new_rands = 1;
    state->c = state->c - 1;
  }
  for (r = 0; r < new_rands; r = r + 1) {
    i = state->i;
    state->s[i & 0x3f] = state->s[i + 0x28 & 0x3f] + state->s[i + 9 & 0x3f];
    state->i = state->i + 1;
  }
  return state->s[i & 0x3f];
}

Assistant:

static inline uint64_t prng_rand(struct prng_rand_t* state)
{
    uint_fast16_t i;
    uint_fast16_t r, new_rands = 0;

    if (!state->c)
    {   // Randomness exhausted, run forward to refill
        new_rands += RAND_REFILL_COUNT + 1;
        state->c = RAND_EXHAUST_LIMIT - 1;
    }
    else
    {
        new_rands = 1;
        state->c--;
    }

    for (r = 0; r < new_rands; r++)
    {
        i = state->i;
        state->s[i & RAND_SMASK] = state->s[(i + RAND_SSIZE - LAG1) & RAND_SMASK]
                                   + state->s[(i + RAND_SSIZE - LAG2) & RAND_SMASK];
        state->i++;
    }
    return state->s[i & RAND_SMASK];
}